

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int store_bits_MSB(cram_block *block,uint val,int nbits)

{
  int iVar1;
  uchar *puVar2;
  uint local_24;
  int local_20;
  uint mask;
  int nbits_local;
  uint val_local;
  cram_block *block_local;
  
  if (block->alloc <= block->byte + 4) {
    if (block->byte == 0) {
      block->alloc = 0x400;
      puVar2 = (uchar *)realloc(block->data,block->alloc + 4);
      block->data = puVar2;
      if (block->data == (uchar *)0x0) {
        return -1;
      }
      *block->data = '\0';
    }
    else {
      block->alloc = block->alloc << 1;
      puVar2 = (uchar *)realloc(block->data,block->alloc + 4);
      block->data = puVar2;
      if (block->data == (uchar *)0x0) {
        return -1;
      }
    }
  }
  if (block->bit + 1 < nbits) {
    local_20 = nbits - (block->bit + 1);
    block->data[block->byte] = block->data[block->byte] | (byte)(val >> ((byte)local_20 & 0x1f));
    block->bit = 7;
    block->byte = block->byte + 1;
    block->data[block->byte] = '\0';
    local_24 = 1 << ((byte)local_20 - 1 & 0x1f);
    do {
      if ((val & local_24) != 0) {
        block->data[block->byte] = block->data[block->byte] | (byte)(1 << ((byte)block->bit & 0x1f))
        ;
      }
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      if (iVar1 == -1) {
        block->bit = 7;
        block->byte = block->byte + 1;
        block->data[block->byte] = '\0';
      }
      local_24 = local_24 >> 1;
      local_20 = local_20 + -1;
    } while (local_20 != 0);
  }
  else {
    block->data[block->byte] =
         block->data[block->byte] |
         (byte)(val << (((char)block->bit + '\x01') - (char)nbits & 0x1fU));
    iVar1 = block->bit - nbits;
    block->bit = iVar1;
    if (iVar1 == -1) {
      block->bit = 7;
      block->byte = block->byte + 1;
      block->data[block->byte] = '\0';
    }
  }
  return 0;
}

Assistant:

static int store_bits_MSB(cram_block *block, unsigned int val, int nbits) {
    /* fprintf(stderr, " store_bits: %02x %d\n", val, nbits); */

    /*
     * Use slow mode until we tweak the huffman generator to never generate
     * codes longer than 24-bits.
     */
    unsigned int mask;

    if (block->byte+4 >= block->alloc) {
	if (block->byte) {
	    block->alloc *= 2;
	    block->data = realloc(block->data, block->alloc + 4);
	    if (!block->data)
		return -1;
	} else {
	    block->alloc = 1024;
	    block->data = realloc(block->data, block->alloc + 4);
	    if (!block->data)
		return -1;
	    block->data[0] = 0; // initialise first byte of buffer
	}
    }

    /* fits in current bit-field */
    if (nbits <= block->bit+1) {
	block->data[block->byte] |= (val << (block->bit+1-nbits));
	if ((block->bit-=nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	    block->data[block->byte] = 0;
	}
	return 0;
    }

    block->data[block->byte] |= (val >> (nbits -= block->bit+1));
    block->bit = 7;
    block->byte++;
    block->data[block->byte] = 0;
				 
    mask = 1<<(nbits-1);
    do {
	if (val & mask)
	    block->data[block->byte] |= (1 << block->bit);
	if (--block->bit == -1) {
	    block->bit = 7;
	    block->byte++;
	    block->data[block->byte] = 0;
	}
	mask >>= 1;
    } while(--nbits);

    return 0;
}